

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O3

void to_top_objects_sel_repeat_new_proc(Am_Object *command_obj,Am_Value *new_sel,Am_Value param_3)

{
  Am_Object local_20;
  Am_Value local_18;
  
  Am_Object::Am_Object(&local_20,command_obj);
  Am_Value::Am_Value(&local_18,new_sel);
  to_top_or_bottom_general_undo_redo(&local_20,false,true,true,true,&local_18);
  Am_Value::~Am_Value(&local_18);
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Selective_Repeat_New_Method, void,
                 to_top_objects_sel_repeat_new,
                 (Am_Object command_obj, Am_Value new_sel,
                  Am_Value /* new_value */))
{
  to_top_or_bottom_general_undo_redo(command_obj, false, true, true, true,
                                     new_sel);
}